

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::
PrintInternal<char[11],char_const*,char[16],std::__cxx11::string,char[6],std::__cxx11::string>
          (Printer *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,char *text,char *key,string *value,char (*args) [11],char **args_1,
          char (*args_2) [16],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
          char (*args_4) [6],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  char *pcVar1;
  char (*key_00) [11];
  char *text_00;
  char *vars_00;
  mapped_type *this_00;
  allocator local_91;
  string local_90;
  allocator local_59;
  key_type local_58;
  char (*local_38) [11];
  char (*args_local) [11];
  string *value_local;
  char *key_local;
  char *text_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars_local;
  Printer *this_local;
  
  local_38 = args;
  args_local = (char (*) [11])value;
  value_local = (string *)key;
  key_local = text;
  text_local = (char *)vars;
  vars_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,key,&local_59);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](vars,&local_58);
  std::__cxx11::string::operator=((string *)this_00,(string *)value);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  vars_00 = text_local;
  text_00 = key_local;
  key_00 = local_38;
  pcVar1 = *args_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,pcVar1,&local_91);
  PrintInternal<char[16],std::__cxx11::string,char[6],std::__cxx11::string>
            (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)vars_00,text_00,*key_00,&local_90,args_2,args_3,args_4,args_5);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

void PrintInternal(std::map<std::string, std::string>* vars, const char* text,
                     const char* key, const std::string& value,
                     const Args&... args) {
    (*vars)[key] = value;
    PrintInternal(vars, text, args...);
  }